

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

size_t gguf_get_arr_n(gguf_context *ctx,int64_t key_id)

{
  int64_t iVar1;
  const_reference pvVar2;
  size_t sVar3;
  size_type sVar4;
  size_type in_RSI;
  long in_RDI;
  size_t type_size;
  size_type local_8;
  
  if (-1 < (long)in_RSI) {
    iVar1 = gguf_get_n_kv((gguf_context *)0x18f309);
    if ((long)in_RSI < iVar1) {
      pvVar2 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                         ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      if (pvVar2->type == GGUF_TYPE_STRING) {
        pvVar2 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                           ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
        local_8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&pvVar2->data_string);
      }
      else {
        std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                  ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
        sVar3 = gguf_type_size((gguf_type)((ulong)in_RDI >> 0x20));
        pvVar2 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                           ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
        sVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar2->data);
        if (sVar4 % sVar3 != 0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
                     ,0x31e,"GGML_ASSERT(%s) failed","ctx->kv[key_id].data.size() % type_size == 0")
          ;
        }
        pvVar2 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                           ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
        local_8 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar2->data);
        local_8 = local_8 / sVar3;
      }
      return local_8;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
             ,0x317,"GGML_ASSERT(%s) failed","key_id >= 0 && key_id < gguf_get_n_kv(ctx)");
}

Assistant:

size_t gguf_get_arr_n(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));

    if (ctx->kv[key_id].type == GGUF_TYPE_STRING) {
        return ctx->kv[key_id].data_string.size();
    }

    const size_t type_size = gguf_type_size(ctx->kv[key_id].type);
    GGML_ASSERT(ctx->kv[key_id].data.size() % type_size == 0);
    return ctx->kv[key_id].data.size() / type_size;
}